

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.c
# Opt level: O2

void BrotliStoreMetaBlock
               (MemoryManager *m,uint8_t *input,size_t start_pos,size_t length,size_t mask,
               uint8_t prev_byte,uint8_t prev_byte2,int is_last,uint32_t num_direct_distance_codes,
               uint32_t distance_postfix_bits,ContextType literal_context_mode,Command *commands,
               size_t n_commands,MetaBlockSplit *mb,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  HuffmanTree *tree;
  ulong uVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  ulong uVar12;
  HistogramLiteral *histogram;
  size_t sVar13;
  HistogramCommand *histogram_00;
  HistogramDistance *histogram_01;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  char *__assertion;
  uint uVar17;
  size_t sVar18;
  long lVar19;
  size_t sVar20;
  bool bVar21;
  BlockEncoder command_enc;
  BlockEncoder literal_enc;
  BlockEncoder distance_enc;
  
  StoreCompressedMetaBlockHeader(is_last,length,storage_ix,storage);
  tree = (HuffmanTree *)BrotliAllocate(m,0x2c08);
  literal_enc.block_types_ = (mb->literal_split).types;
  literal_enc.block_lengths_ = (mb->literal_split).lengths;
  literal_enc.num_block_types_ = (mb->literal_split).num_types;
  literal_enc.num_blocks_ = (mb->literal_split).num_blocks;
  literal_enc.alphabet_size_ = 0x100;
  literal_enc.block_split_code_.type_code_calculator.last_type = 1;
  literal_enc.block_split_code_.type_code_calculator.second_last_type = 0;
  literal_enc.block_ix_ = 0;
  if (literal_enc.num_blocks_ == 0) {
    literal_enc.block_len_ = 0;
  }
  else {
    literal_enc.block_len_ = (size_t)*literal_enc.block_lengths_;
  }
  literal_enc.entropy_ix_ = 0;
  literal_enc.depths_ = (uint8_t *)0x0;
  literal_enc.bits_ = (uint16_t *)0x0;
  command_enc.block_types_ = (mb->command_split).types;
  command_enc.block_lengths_ = (mb->command_split).lengths;
  command_enc.num_block_types_ = (mb->command_split).num_types;
  command_enc.num_blocks_ = (mb->command_split).num_blocks;
  command_enc.alphabet_size_ = 0x2c0;
  command_enc.block_split_code_.type_code_calculator.last_type = 1;
  command_enc.block_split_code_.type_code_calculator.second_last_type = 0;
  command_enc.block_ix_ = 0;
  if (command_enc.num_blocks_ == 0) {
    command_enc.block_len_ = 0;
  }
  else {
    command_enc.block_len_ = (size_t)*command_enc.block_lengths_;
  }
  command_enc.entropy_ix_ = 0;
  command_enc.depths_ = (uint8_t *)0x0;
  command_enc.bits_ = (uint16_t *)0x0;
  distance_enc.block_types_ = (mb->distance_split).types;
  distance_enc.block_lengths_ = (mb->distance_split).lengths;
  distance_enc.num_block_types_ = (mb->distance_split).num_types;
  distance_enc.num_blocks_ = (mb->distance_split).num_blocks;
  distance_enc.block_split_code_.type_code_calculator.last_type = 1;
  distance_enc.block_split_code_.type_code_calculator.second_last_type = 0;
  distance_enc.block_ix_ = 0;
  if (distance_enc.num_blocks_ == 0) {
    distance_enc.block_len_ = 0;
  }
  else {
    distance_enc.block_len_ = (size_t)*distance_enc.block_lengths_;
  }
  distance_enc.entropy_ix_ = 0;
  distance_enc.depths_ = (uint8_t *)0x0;
  distance_enc.bits_ = (uint16_t *)0x0;
  distance_enc.alphabet_size_ =
       (ulong)(num_direct_distance_codes + (0x30 << ((byte)distance_postfix_bits & 0x1f)) + 0x10);
  BuildAndStoreBlockSwitchEntropyCodes(&literal_enc,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(&command_enc,tree,storage_ix,storage);
  BuildAndStoreBlockSwitchEntropyCodes(&distance_enc,tree,storage_ix,storage);
  if (distance_postfix_bits < 4) {
    uVar12 = *storage_ix;
    *(ulong *)(storage + (uVar12 >> 3)) =
         (ulong)distance_postfix_bits << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
    uVar8 = uVar12 + 2;
    *storage_ix = uVar8;
    uVar14 = num_direct_distance_codes >> ((byte)distance_postfix_bits & 0x1f);
    if (uVar14 < 0x10) {
      *(ulong *)(storage + (uVar8 >> 3)) =
           (ulong)uVar14 << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
      uVar12 = uVar12 + 6;
      *storage_ix = uVar12;
      for (uVar8 = 0; uVar8 < (mb->literal_split).num_types; uVar8 = uVar8 + 1) {
        if (CONTEXT_SIGNED < literal_context_mode) goto LAB_00115a50;
        *(ulong *)(storage + (uVar12 >> 3)) =
             (ulong)literal_context_mode << ((byte)uVar12 & 7) | (ulong)storage[uVar12 >> 3];
        uVar12 = uVar12 + 2;
        *storage_ix = uVar12;
      }
      if (mb->literal_context_map_size == 0) {
        StoreTrivialContextMap(mb->literal_histograms_size,6,tree,storage_ix,storage);
      }
      else {
        EncodeContextMap(m,mb->literal_context_map,mb->literal_context_map_size,
                         mb->literal_histograms_size,tree,storage_ix,storage);
      }
      if (mb->distance_context_map_size == 0) {
        StoreTrivialContextMap(mb->distance_histograms_size,2,tree,storage_ix,storage);
      }
      else {
        EncodeContextMap(m,mb->distance_context_map,mb->distance_context_map_size,
                         mb->distance_histograms_size,tree,storage_ix,storage);
      }
      sVar13 = literal_enc.alphabet_size_;
      histogram = mb->literal_histograms;
      sVar18 = mb->literal_histograms_size;
      sVar20 = literal_enc.alphabet_size_ * sVar18;
      if (sVar20 == 0) {
        literal_enc.depths_ = (uint8_t *)0x0;
        literal_enc.bits_ = (uint16_t *)0x0;
      }
      else {
        literal_enc.depths_ = (uint8_t *)BrotliAllocate(m,sVar20);
        literal_enc.bits_ = (uint16_t *)BrotliAllocate(m,sVar20 * 2);
      }
      lVar9 = 0;
      lVar19 = 0;
      while (sVar20 = command_enc.alphabet_size_, bVar21 = sVar18 != 0, sVar18 = sVar18 - 1, bVar21)
      {
        BuildAndStoreHuffmanTree
                  (histogram->data_,sVar13,tree,literal_enc.depths_ + lVar9,
                   (uint16_t *)((long)literal_enc.bits_ + lVar19),storage_ix,storage);
        histogram = histogram + 1;
        lVar19 = lVar19 + sVar13 * 2;
        lVar9 = lVar9 + sVar13;
      }
      histogram_00 = mb->command_histograms;
      sVar18 = mb->command_histograms_size;
      sVar13 = command_enc.alphabet_size_ * sVar18;
      if (sVar13 == 0) {
        command_enc.depths_ = (uint8_t *)0x0;
        command_enc.bits_ = (uint16_t *)0x0;
      }
      else {
        command_enc.depths_ = (uint8_t *)BrotliAllocate(m,sVar13);
        command_enc.bits_ = (uint16_t *)BrotliAllocate(m,sVar13 * 2);
      }
      lVar9 = 0;
      lVar19 = 0;
      while (sVar13 = distance_enc.alphabet_size_, bVar21 = sVar18 != 0, sVar18 = sVar18 - 1, bVar21
            ) {
        BuildAndStoreHuffmanTree
                  (histogram_00->data_,sVar20,tree,command_enc.depths_ + lVar9,
                   (uint16_t *)((long)command_enc.bits_ + lVar19),storage_ix,storage);
        histogram_00 = histogram_00 + 1;
        lVar19 = lVar19 + sVar20 * 2;
        lVar9 = lVar9 + sVar20;
      }
      histogram_01 = mb->distance_histograms;
      sVar18 = mb->distance_histograms_size;
      sVar20 = distance_enc.alphabet_size_ * sVar18;
      if (sVar20 == 0) {
        distance_enc.depths_ = (uint8_t *)0x0;
        distance_enc.bits_ = (uint16_t *)0x0;
      }
      else {
        distance_enc.depths_ = (uint8_t *)BrotliAllocate(m,sVar20);
        distance_enc.bits_ = (uint16_t *)BrotliAllocate(m,sVar20 * 2);
      }
      lVar9 = 0;
      lVar19 = 0;
      while (bVar21 = sVar18 != 0, sVar18 = sVar18 - 1, bVar21) {
        BuildAndStoreHuffmanTree
                  (histogram_01->data_,sVar13,tree,distance_enc.depths_ + lVar9,
                   (uint16_t *)((long)distance_enc.bits_ + lVar19),storage_ix,storage);
        histogram_01 = histogram_01 + 1;
        lVar19 = lVar19 + sVar13 * 2;
        lVar9 = lVar9 + sVar13;
      }
      BrotliFree(m,tree);
      sVar18 = 0;
      while( true ) {
        if (sVar18 == n_commands) {
          CleanupBlockEncoder(m,&distance_enc);
          CleanupBlockEncoder(m,&command_enc);
          CleanupBlockEncoder(m,&literal_enc);
          if (is_last != 0) {
            uVar14 = (int)*storage_ix + 7;
            *storage_ix = (ulong)(uVar14 & 0xfffffff8);
            storage[uVar14 >> 3] = '\0';
          }
          return;
        }
        uVar14 = commands[sVar18].insert_len_;
        uVar8 = (ulong)uVar14;
        uVar17 = commands[sVar18].copy_len_;
        uVar4 = commands[sVar18].dist_extra_;
        uVar2 = commands[sVar18].cmd_prefix_;
        uVar3 = commands[sVar18].dist_prefix_;
        StoreSymbol(&command_enc,(ulong)uVar2,storage_ix,storage);
        uVar11 = uVar14;
        if (5 < uVar8) {
          if (uVar14 < 0x82) {
            uVar11 = 0x1f;
            uVar6 = (uint)(uVar8 - 2);
            if (uVar6 != 0) {
              for (; uVar6 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            iVar10 = (uVar11 ^ 0xffffffe0) + 0x1f;
            uVar11 = (int)(uVar8 - 2 >> ((byte)iVar10 & 0x3f)) + iVar10 * 2 + 2;
          }
          else if (uVar14 < 0x842) {
            uVar11 = 0x1f;
            if (uVar14 - 0x42 != 0) {
              for (; uVar14 - 0x42 >> uVar11 == 0; uVar11 = uVar11 - 1) {
              }
            }
            uVar11 = (uVar11 ^ 0xffffffe0) + 0x2a;
          }
          else {
            uVar11 = 0x15;
            if (0x1841 < uVar14) {
              uVar11 = 0x17 - (uVar14 < 0x5842);
            }
          }
        }
        uVar6 = uVar17 & 0xffffff;
        uVar17 = uVar17 >> 0x18 ^ uVar6;
        if (uVar17 < 10) {
          uVar15 = uVar17 + 0xfffe;
        }
        else if (uVar17 < 0x86) {
          uVar15 = 0x1f;
          uVar7 = (uint)((ulong)uVar17 - 6);
          if (uVar7 != 0) {
            for (; uVar7 >> uVar15 == 0; uVar15 = uVar15 - 1) {
            }
          }
          iVar10 = (uVar15 ^ 0xffffffe0) + 0x1f;
          uVar15 = (int)((ulong)uVar17 - 6 >> ((byte)iVar10 & 0x3f)) + iVar10 * 2 + 4;
        }
        else {
          uVar15 = 0x17;
          if (uVar17 < 0x846) {
            uVar15 = 0x1f;
            if (uVar17 - 0x46 != 0) {
              for (; uVar17 - 0x46 >> uVar15 == 0; uVar15 = uVar15 - 1) {
              }
            }
            uVar15 = (uVar15 ^ 0xffffffe0) + 0x2c;
          }
        }
        uVar12 = (ulong)((uVar11 & 0xffff) << 2);
        iVar10 = *(int *)((long)kInsExtra + uVar12);
        uVar16 = (ulong)((uVar15 & 0xffff) << 2);
        uVar12 = (ulong)(uVar17 - *(int *)((long)kCopyBase + uVar16)) << ((byte)iVar10 & 0x3f) |
                 (ulong)(uVar14 - *(int *)((long)kInsBase + uVar12));
        uVar14 = iVar10 + *(int *)((long)kCopyExtra + uVar16);
        if (uVar12 >> ((byte)uVar14 & 0x3f) != 0) goto LAB_00115a50;
        if (0x38 < uVar14) break;
        uVar16 = *storage_ix;
        *(ulong *)(storage + (uVar16 >> 3)) =
             uVar12 << ((byte)uVar16 & 7) | (ulong)storage[uVar16 >> 3];
        *storage_ix = uVar14 + uVar16;
        if (mb->literal_context_map_size == 0) {
          while (bVar21 = uVar8 != 0, uVar8 = uVar8 - 1, bVar21) {
            StoreSymbol(&literal_enc,(ulong)input[start_pos & mask],storage_ix,storage);
            start_pos = start_pos + 1;
          }
        }
        else {
          while (bVar21 = uVar8 != 0, uVar8 = uVar8 - 1, bVar21) {
            if (literal_context_mode < 4) {
              switch(literal_context_mode) {
              case CONTEXT_LSB6:
                bVar5 = prev_byte & 0x3f;
                break;
              case CONTEXT_MSB6:
                bVar5 = prev_byte >> 2;
                break;
              case CONTEXT_UTF8:
                bVar5 = ""[(ulong)prev_byte2 + 0x100] | ""[prev_byte];
                break;
              case CONTEXT_SIGNED:
                bVar5 = ""[prev_byte] * '\b' + ""[prev_byte2];
              }
            }
            else {
              bVar5 = 0;
            }
            bVar1 = input[start_pos & mask];
            StoreSymbolWithContext
                      (&literal_enc,(ulong)bVar1,(ulong)bVar5,mb->literal_context_map,storage_ix,
                       storage,6);
            start_pos = start_pos + 1;
            prev_byte2 = prev_byte;
            prev_byte = bVar1;
          }
        }
        start_pos = start_pos + uVar6;
        if (uVar6 != 0) {
          prev_byte2 = input[start_pos - 2 & mask];
          prev_byte = input[start_pos - 1 & mask];
          if (0x7f < uVar2) {
            if (mb->distance_context_map_size == 0) {
              StoreSymbol(&distance_enc,(ulong)uVar3,storage_ix,storage);
            }
            else {
              sVar13 = (size_t)(uVar2 & 7);
              if (2 < (uVar2 & 7)) {
                sVar13 = 3;
              }
              sVar20 = 3;
              if (((uVar2 >> 6) - 2 & 0xfffffffd) == 0) {
                sVar20 = sVar13;
              }
              if (uVar2 >> 6 == 7) {
                sVar20 = sVar13;
              }
              StoreSymbolWithContext
                        (&distance_enc,(ulong)uVar3,sVar20,mb->distance_context_map,storage_ix,
                         storage,2);
            }
            if ((uVar4 & 0xffffff) >> ((byte)(uVar4 >> 0x18) & 0x3f) != 0) goto LAB_00115a50;
            if (0x38ffffff < uVar4) break;
            uVar8 = *storage_ix;
            *(ulong *)(storage + (uVar8 >> 3)) =
                 (ulong)(uVar4 & 0xffffff) << ((byte)uVar8 & 7) | (ulong)storage[uVar8 >> 3];
            *storage_ix = (uVar4 >> 0x18) + uVar8;
          }
        }
        sVar18 = sVar18 + 1;
      }
      __assertion = "n_bits <= 56";
      uVar14 = 0x37;
      goto LAB_00115a80;
    }
  }
LAB_00115a50:
  __assertion = "(bits >> n_bits) == 0";
  uVar14 = 0x36;
LAB_00115a80:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/././write_bits.h"
                ,uVar14,
                "void BrotliWriteBits(size_t, uint64_t, size_t *restrict, uint8_t *restrict)");
}

Assistant:

void BrotliStoreMetaBlock(MemoryManager* m,
                          const uint8_t* input,
                          size_t start_pos,
                          size_t length,
                          size_t mask,
                          uint8_t prev_byte,
                          uint8_t prev_byte2,
                          BROTLI_BOOL is_last,
                          uint32_t num_direct_distance_codes,
                          uint32_t distance_postfix_bits,
                          ContextType literal_context_mode,
                          const Command *commands,
                          size_t n_commands,
                          const MetaBlockSplit* mb,
                          size_t *storage_ix,
                          uint8_t *storage) {
  size_t pos = start_pos;
  size_t i;
  size_t num_distance_codes =
      BROTLI_NUM_DISTANCE_SHORT_CODES + num_direct_distance_codes +
      (48u << distance_postfix_bits);
  HuffmanTree* tree;
  BlockEncoder literal_enc;
  BlockEncoder command_enc;
  BlockEncoder distance_enc;

  StoreCompressedMetaBlockHeader(is_last, length, storage_ix, storage);

  tree = BROTLI_ALLOC(m, HuffmanTree, MAX_HUFFMAN_TREE_SIZE);
  if (BROTLI_IS_OOM(m)) return;
  InitBlockEncoder(&literal_enc, 256, mb->literal_split.num_types,
      mb->literal_split.types, mb->literal_split.lengths,
      mb->literal_split.num_blocks);
  InitBlockEncoder(&command_enc, BROTLI_NUM_COMMAND_SYMBOLS,
      mb->command_split.num_types, mb->command_split.types,
      mb->command_split.lengths, mb->command_split.num_blocks);
  InitBlockEncoder(&distance_enc, num_distance_codes,
      mb->distance_split.num_types, mb->distance_split.types,
      mb->distance_split.lengths, mb->distance_split.num_blocks);

  BuildAndStoreBlockSwitchEntropyCodes(&literal_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(&command_enc, tree, storage_ix, storage);
  BuildAndStoreBlockSwitchEntropyCodes(
      &distance_enc, tree, storage_ix, storage);

  BrotliWriteBits(2, distance_postfix_bits, storage_ix, storage);
  BrotliWriteBits(4, num_direct_distance_codes >> distance_postfix_bits,
                  storage_ix, storage);
  for (i = 0; i < mb->literal_split.num_types; ++i) {
    BrotliWriteBits(2, literal_context_mode, storage_ix, storage);
  }

  if (mb->literal_context_map_size == 0) {
    StoreTrivialContextMap(mb->literal_histograms_size,
        BROTLI_LITERAL_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->literal_context_map, mb->literal_context_map_size,
        mb->literal_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  if (mb->distance_context_map_size == 0) {
    StoreTrivialContextMap(mb->distance_histograms_size,
        BROTLI_DISTANCE_CONTEXT_BITS, tree, storage_ix, storage);
  } else {
    EncodeContextMap(m,
        mb->distance_context_map, mb->distance_context_map_size,
        mb->distance_histograms_size, tree, storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return;
  }

  BuildAndStoreEntropyCodesLiteral(m, &literal_enc, mb->literal_histograms,
      mb->literal_histograms_size, tree, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesCommand(m, &command_enc, mb->command_histograms,
      mb->command_histograms_size, tree, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BuildAndStoreEntropyCodesDistance(m, &distance_enc, mb->distance_histograms,
      mb->distance_histograms_size, tree, storage_ix, storage);
  if (BROTLI_IS_OOM(m)) return;
  BROTLI_FREE(m, tree);

  for (i = 0; i < n_commands; ++i) {
    const Command cmd = commands[i];
    size_t cmd_code = cmd.cmd_prefix_;
    StoreSymbol(&command_enc, cmd_code, storage_ix, storage);
    StoreCommandExtra(&cmd, storage_ix, storage);
    if (mb->literal_context_map_size == 0) {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        StoreSymbol(&literal_enc, input[pos & mask], storage_ix, storage);
        ++pos;
      }
    } else {
      size_t j;
      for (j = cmd.insert_len_; j != 0; --j) {
        size_t context = Context(prev_byte, prev_byte2, literal_context_mode);
        uint8_t literal = input[pos & mask];
        StoreSymbolWithContext(&literal_enc, literal, context,
            mb->literal_context_map, storage_ix, storage,
            BROTLI_LITERAL_CONTEXT_BITS);
        prev_byte2 = prev_byte;
        prev_byte = literal;
        ++pos;
      }
    }
    pos += CommandCopyLen(&cmd);
    if (CommandCopyLen(&cmd)) {
      prev_byte2 = input[(pos - 2) & mask];
      prev_byte = input[(pos - 1) & mask];
      if (cmd.cmd_prefix_ >= 128) {
        size_t dist_code = cmd.dist_prefix_;
        uint32_t distnumextra = cmd.dist_extra_ >> 24;
        uint64_t distextra = cmd.dist_extra_ & 0xffffff;
        if (mb->distance_context_map_size == 0) {
          StoreSymbol(&distance_enc, dist_code, storage_ix, storage);
        } else {
          size_t context = CommandDistanceContext(&cmd);
          StoreSymbolWithContext(&distance_enc, dist_code, context,
              mb->distance_context_map, storage_ix, storage,
              BROTLI_DISTANCE_CONTEXT_BITS);
        }
        BrotliWriteBits(distnumextra, distextra, storage_ix, storage);
      }
    }
  }
  CleanupBlockEncoder(m, &distance_enc);
  CleanupBlockEncoder(m, &command_enc);
  CleanupBlockEncoder(m, &literal_enc);
  if (is_last) {
    JumpToByteBoundary(storage_ix, storage);
  }
}